

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int equation_system_solve(aom_equation_system_t *eqns)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t size;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  double *pdVar7;
  bool bVar8;
  void *__dest;
  void *__dest_00;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  int iVar12;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  uint uVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  void *pvVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  undefined8 local_58;
  
  uVar5 = eqns->n;
  lVar23 = (long)(int)uVar5;
  size = lVar23 * 8;
  __dest = aom_malloc(size);
  __dest_00 = aom_malloc(size * lVar23);
  if ((__dest_00 == (void *)0x0) || (__dest == (void *)0x0)) {
    iVar12 = 0;
    fprintf(_stderr,"Unable to allocate temp values of size %dx%d\n",(ulong)uVar5,(ulong)uVar5);
  }
  else {
    memcpy(__dest_00,eqns->A,size * lVar23);
    memcpy(__dest,eqns->b,size);
    iVar6 = eqns->n;
    uVar9 = (ulong)iVar6;
    pdVar7 = eqns->x;
    uVar16 = uVar5 - 1;
    if (1 < (int)uVar5) {
      lVar17 = lVar23 + -1;
      pvVar15 = (void *)((long)__dest_00 + (lVar23 + -2) * uVar9 * 8);
      lVar19 = uVar9 * 8;
      pvVar1 = (void *)((long)__dest_00 + lVar17 * uVar9 * 8);
      local_58 = (void *)((long)__dest_00 + uVar9 * 8);
      uVar14 = 0;
      pvVar11 = pvVar15;
      pvVar20 = pvVar1;
      lVar10 = lVar17;
      pvVar13 = __dest_00;
      do {
        do {
          lVar21 = lVar10 + -1;
          if (ABS(*(double *)((long)__dest_00 + lVar21 * uVar9 * 8 + uVar14 * 8)) <
              ABS(*(double *)((long)__dest_00 + lVar10 * uVar9 * 8 + uVar14 * 8))) {
            lVar10 = 0;
            do {
              uVar4 = *(undefined8 *)((long)pvVar20 + lVar10 * 8);
              *(undefined8 *)((long)pvVar20 + lVar10 * 8) =
                   *(undefined8 *)((long)pvVar11 + lVar10 * 8);
              *(undefined8 *)((long)pvVar11 + lVar10 * 8) = uVar4;
              lVar10 = lVar10 + 1;
            } while (lVar23 != lVar10);
            puVar2 = (undefined8 *)((long)__dest + lVar21 * 8);
            uVar4 = *puVar2;
            puVar3 = (undefined8 *)((long)__dest + lVar21 * 8);
            *puVar3 = puVar2[1];
            puVar3[1] = uVar4;
          }
          pvVar11 = (void *)((long)pvVar11 + uVar9 * -8);
          pvVar20 = (void *)((long)pvVar20 + uVar9 * -8);
          lVar10 = lVar21;
        } while ((long)uVar14 < lVar21);
        pvVar11 = local_58;
        uVar22 = uVar14;
        do {
          dVar25 = *(double *)((long)__dest_00 + (long)((int)uVar14 * iVar6) * 8 + uVar14 * 8);
          if (ABS(dVar25) < 1e-16) goto LAB_002a4f4c;
          uVar22 = uVar22 + 1;
          dVar25 = -*(double *)((long)__dest_00 + uVar22 * uVar9 * 8 + uVar14 * 8) / dVar25;
          lVar10 = 0;
          do {
            *(double *)((long)pvVar11 + lVar10 * 8) =
                 *(double *)((long)pvVar13 + lVar10 * 8) * dVar25 +
                 *(double *)((long)pvVar11 + lVar10 * 8);
            lVar10 = lVar10 + 1;
          } while (lVar23 != lVar10);
          *(double *)((long)__dest + uVar22 * 8) =
               dVar25 * *(double *)((long)__dest + uVar14 * 8) +
               *(double *)((long)__dest + uVar22 * 8);
          pvVar11 = (void *)((long)pvVar11 + lVar19);
        } while (uVar22 != uVar16);
        uVar14 = uVar14 + 1;
        local_58 = (void *)((long)local_58 + lVar19);
        pvVar13 = (void *)((long)pvVar13 + lVar19);
        pvVar11 = pvVar15;
        pvVar20 = pvVar1;
        lVar10 = lVar17;
      } while (uVar14 != uVar16);
    }
    iVar12 = 1;
    if (0 < (int)uVar5) {
      pvVar15 = (void *)((long)__dest_00 + (lVar23 + -1) * uVar9 * 8);
      pdVar18 = pdVar7;
      lVar19 = lVar23;
      lVar17 = (long)(int)uVar16;
      do {
        lVar17 = lVar17 + 1;
        lVar10 = lVar19 + -1;
        dVar25 = *(double *)((long)__dest_00 + (long)(iVar6 * (int)lVar10) * 8 + lVar19 * 8 + -8);
        if (ABS(dVar25) < 1e-16) goto LAB_002a4f4c;
        dVar24 = 0.0;
        lVar21 = lVar23;
        if (lVar19 <= (int)uVar16) {
          do {
            dVar24 = dVar24 + *(double *)((long)pvVar15 + lVar21 * 8) * pdVar18[lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar17 != lVar21);
        }
        pdVar7[lVar10] = (*(double *)((long)__dest + lVar10 * 8) - dVar24) / dVar25;
        pvVar15 = (void *)((long)pvVar15 + ~uVar9 * 8);
        pdVar18 = pdVar18 + -1;
        bVar8 = 1 < lVar19;
        lVar19 = lVar10;
      } while (bVar8);
    }
  }
LAB_002a4f4e:
  aom_free(__dest);
  aom_free(__dest_00);
  return iVar12;
LAB_002a4f4c:
  iVar12 = 0;
  goto LAB_002a4f4e;
}

Assistant:

static int equation_system_solve(aom_equation_system_t *eqns) {
  const int n = eqns->n;
  double *b = (double *)aom_malloc(sizeof(*b) * n);
  double *A = (double *)aom_malloc(sizeof(*A) * n * n);
  int ret = 0;
  if (A == NULL || b == NULL) {
    fprintf(stderr, "Unable to allocate temp values of size %dx%d\n", n, n);
    aom_free(b);
    aom_free(A);
    return 0;
  }
  memcpy(A, eqns->A, sizeof(*eqns->A) * n * n);
  memcpy(b, eqns->b, sizeof(*eqns->b) * n);
  ret = linsolve(n, A, eqns->n, b, eqns->x);
  aom_free(b);
  aom_free(A);

  if (ret == 0) {
    return 0;
  }
  return 1;
}